

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-hexfloat.cc
# Opt level: O2

void __thiscall ManyDoublesRoundtripTest::RunShard(ManyDoublesRoundtripTest *this,int shard)

{
  uint uVar1;
  size_t sVar2;
  int line;
  LiteralType literal_type;
  char *message;
  uint uVar3;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d8;
  uint local_d0;
  int local_cc;
  AssertionResult gtest_ar;
  AssertHelper local_b8;
  uint64_t bits;
  ManyDoublesRoundtripTest *local_a8;
  uint64_t new_bits;
  char buffer [100];
  
  local_d0 = 0xffffffff;
  uVar3 = 0;
  local_cc = shard;
  local_a8 = this;
  while( true ) {
    uVar1 = shard;
    if (uVar1 < uVar3) {
      if (local_cc == 0) {
        puts("done.");
        fflush(_stdout);
      }
      return;
    }
    if ((local_cc == 0) && (uVar1 >> 0x18 != local_d0)) {
      printf("value: 0x%08x (%d%%)\r",(ulong)uVar1,
             (ulong)(uint)(int)(((double)uVar1 * 100.0) / 4294967295.0));
      fflush(_stdout);
      local_d0 = uVar1 >> 0x18;
    }
    bits = (ulong)uVar1 * 0x100000001;
    wabt::WriteDoubleHex(buffer,100,bits);
    sVar2 = strlen(buffer);
    local_d8.ptr_._0_4_ = 0;
    literal_type = Nan - ((bits & 0xfffffffffffff) == 0);
    if ((~bits & 0x7ff0000000000000) != 0) {
      literal_type = Hexfloat;
    }
    local_b8.data_._0_4_ = wabt::ParseDouble(literal_type,buffer,buffer + (int)sVar2,&new_bits);
    testing::internal::CmpHelperEQ<wabt::Result::Enum,wabt::Result>
              ((internal *)&gtest_ar,"Result::Ok",
               "ParseDouble(ClassifyDouble(bits), buffer, buffer + len, &new_bits)",
               (Enum *)&local_d8,(Result *)&local_b8);
    if (gtest_ar.success_ == false) break;
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)&gtest_ar,"new_bits","bits",&new_bits,&bits);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_d8);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = "";
      }
      else {
        message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      line = 0x100;
      goto LAB_0012669c;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    shard = (local_a8->super_ThreadedTest).num_threads_ + uVar1;
    uVar3 = uVar1;
  }
  testing::Message::Message((Message *)&local_d8);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    message = "";
  }
  else {
    message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  line = 0xff;
LAB_0012669c:
  testing::internal::AssertHelper::AssertHelper
            (&local_b8,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-hexfloat.cc"
             ,line,message);
  testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_d8);
  testing::internal::AssertHelper::~AssertHelper(&local_b8);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_d8);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

virtual void RunShard(int shard) {
    char buffer[100];
    FOREACH_UINT32(halfbits) {
      LOG_COMPLETION(halfbits);
      uint64_t bits = (static_cast<uint64_t>(halfbits) << 32) | halfbits;
      WriteDoubleHex(buffer, sizeof(buffer), bits);
      int len = strlen(buffer);

      uint64_t new_bits;
      ASSERT_EQ(Result::Ok, ParseDouble(ClassifyDouble(bits), buffer,
                                        buffer + len, &new_bits));
      ASSERT_EQ(new_bits, bits);
    }
    LOG_DONE();
  }